

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

bool checkInterfacePropertyCompatibility<bool>
               (cmGeneratorTarget *tgt,string *p,string *config,char *defaultValue,CompatibleType t,
               bool *param_6)

{
  cmGeneratorTarget *this;
  pointer pbVar1;
  bool bVar2;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var3;
  iterator iVar4;
  vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *pvVar5;
  pointer ppcVar6;
  ostream *poVar7;
  size_t sVar8;
  int iVar9;
  char *pcVar10;
  bool bVar11;
  string reportEntry;
  string report;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  propKeys;
  ostringstream e;
  string interfaceProperty;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  headPropKeys;
  uint local_2a0;
  string local_290;
  cmGeneratorTarget *local_270;
  long *local_268;
  long local_258 [2];
  cmGeneratorTarget *local_248;
  string local_240;
  _Base_ptr local_220;
  char *local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_208;
  pointer local_200;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1f8;
  string local_1e0 [3];
  ios_base local_170 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_218 = defaultValue;
  bVar2 = cmTarget::GetPropertyAsBool(tgt->Target,p);
  local_2a0 = (uint)bVar2;
  cmGeneratorTarget::GetPropertyKeys_abi_cxx11_(&local_48,tgt);
  _Var3 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                    (local_48.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     local_48.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,p);
  bVar11 = _Var3._M_current !=
           local_48.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  iVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find(&(tgt->LinkImplicitNullProperties)._M_t,p);
  local_220 = &(tgt->LinkImplicitNullProperties)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (iVar4._M_node != local_220 &&
      _Var3._M_current !=
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    __assert_fail("(impliedByUse ^ explicitlySet) || (!impliedByUse && !explicitlySet)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmGeneratorTarget.cxx"
                  ,0x10b6,
                  "PropertyType checkInterfacePropertyCompatibility(const cmGeneratorTarget *, const std::string &, const std::string &, const char *, CompatibleType, PropertyType *) [PropertyType = bool]"
                 );
  }
  pvVar5 = cmGeneratorTarget::GetLinkImplementationClosure(tgt,config);
  if ((pvVar5->
      super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>).
      _M_impl.super__Vector_impl_data._M_start !=
      (pvVar5->
      super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>).
      _M_impl.super__Vector_impl_data._M_finish) {
    local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_240," * Target \"","");
    std::__cxx11::string::_M_append((char *)&local_240,(ulong)(tgt->Target->Name)._M_dataplus._M_p);
    if (_Var3._M_current !=
        local_48.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::__cxx11::string::append((char *)&local_240);
      pcVar10 = "FALSE";
      if (bVar2) {
        pcVar10 = "TRUE";
      }
      local_1e0[0]._M_dataplus._M_p = (pointer)&local_1e0[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1e0,pcVar10,pcVar10 + ((ulong)bVar2 ^ 5));
      std::__cxx11::string::_M_append((char *)&local_240,(ulong)local_1e0[0]._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0[0]._M_dataplus._M_p != &local_1e0[0].field_2) {
        operator_delete(local_1e0[0]._M_dataplus._M_p,local_1e0[0].field_2._M_allocated_capacity + 1
                       );
      }
    }
    std::__cxx11::string::append((char *)&local_240);
    local_210 = local_48.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    local_248 = tgt;
    local_208 = _Var3._M_current;
    std::operator+(&local_68,"INTERFACE_",p);
    ppcVar6 = (pvVar5->
              super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    if (ppcVar6 !=
        (pvVar5->
        super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>).
        _M_impl.super__Vector_impl_data._M_finish) {
      do {
        local_270 = *ppcVar6;
        local_200 = ppcVar6;
        cmGeneratorTarget::GetPropertyKeys_abi_cxx11_(&local_1f8,local_270);
        _Var3 = std::
                __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                          (local_1f8.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start,
                           local_1f8.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish,&local_68);
        pbVar1 = local_1f8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        bVar2 = cmTarget::GetPropertyAsBool(local_270->Target,&local_68);
        local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
        local_290._M_string_length = 0;
        local_290.field_2._M_local_buf[0] = '\0';
        if (_Var3._M_current != pbVar1) {
          std::__cxx11::string::append((char *)&local_290);
          std::__cxx11::string::_M_append
                    ((char *)&local_290,(ulong)(local_270->Target->Name)._M_dataplus._M_p);
          std::__cxx11::string::append((char *)&local_290);
          pcVar10 = "FALSE";
          if (bVar2) {
            pcVar10 = "TRUE";
          }
          local_1e0[0]._M_dataplus._M_p = (pointer)&local_1e0[0].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1e0,pcVar10,pcVar10 + ((ulong)bVar2 ^ 5));
          std::__cxx11::string::_M_append((char *)&local_290,(ulong)local_1e0[0]._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1e0[0]._M_dataplus._M_p != &local_1e0[0].field_2) {
            operator_delete(local_1e0[0]._M_dataplus._M_p,
                            local_1e0[0].field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::string::append((char *)&local_290);
        }
        if (local_208 == local_210) {
          if (iVar4._M_node == local_220) {
            if (_Var3._M_current != pbVar1) {
              if (!bVar11) {
                local_1e0[0]._M_dataplus._M_p = (pointer)&local_1e0[0].field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_1e0,local_290._M_dataplus._M_p,
                           local_290._M_dataplus._M_p + local_290._M_string_length);
                std::__cxx11::string::append((char *)local_1e0);
                std::__cxx11::string::_M_append
                          ((char *)&local_240,(ulong)local_1e0[0]._M_dataplus._M_p);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1e0[0]._M_dataplus._M_p != &local_1e0[0].field_2) {
                  operator_delete(local_1e0[0]._M_dataplus._M_p,
                                  local_1e0[0].field_2._M_allocated_capacity + 1);
                }
                bVar11 = true;
                local_2a0 = (uint)bVar2;
                bVar2 = false;
                goto LAB_0039065b;
              }
              std::__cxx11::string::_M_append((char *)&local_240,(ulong)local_290._M_dataplus._M_p);
              compatibilityAgree_abi_cxx11_(local_1e0,t,false);
              std::__cxx11::string::_M_append
                        ((char *)&local_240,(ulong)local_1e0[0]._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1e0[0]._M_dataplus._M_p != &local_1e0[0].field_2) {
                operator_delete(local_1e0[0]._M_dataplus._M_p,
                                local_1e0[0].field_2._M_allocated_capacity + 1);
              }
              if (bVar2 != local_2a0._0_1_) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e0);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1e0,"The INTERFACE_",0xe);
                poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)local_1e0,(p->_M_dataplus)._M_p,p->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar7," property of \"",0xe);
                poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                   (poVar7,(local_270->Target->Name)._M_dataplus._M_p,
                                    (local_270->Target->Name)._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar7,"\" does\nnot agree with the value of ",0x23);
                poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                   (poVar7,(p->_M_dataplus)._M_p,p->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar7," already determined\nfor \"",0x19);
                poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                   (poVar7,(local_248->Target->Name)._M_dataplus._M_p,
                                    (local_248->Target->Name)._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\".\n",3);
                std::__cxx11::stringbuf::str();
                cmSystemTools::Error((char *)local_268,(char *)0x0,(char *)0x0,(char *)0x0);
                goto LAB_00390335;
              }
            }
            goto LAB_00390655;
          }
          if (_Var3._M_current == pbVar1) {
            local_2a0 = 0;
            goto LAB_00390655;
          }
          std::__cxx11::string::_M_append((char *)&local_240,(ulong)local_290._M_dataplus._M_p);
          compatibilityAgree_abi_cxx11_(local_1e0,t,false);
          std::__cxx11::string::_M_append((char *)&local_240,(ulong)local_1e0[0]._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1e0[0]._M_dataplus._M_p != &local_1e0[0].field_2) {
            operator_delete(local_1e0[0]._M_dataplus._M_p,
                            local_1e0[0].field_2._M_allocated_capacity + 1);
          }
          if (!bVar2) {
            local_2a0 = 0;
            goto LAB_00390655;
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e0,"Property ",9);
          pcVar10 = local_218;
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1e0,(p->_M_dataplus)._M_p,p->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," on target \"",0xc);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,(local_248->Target->Name)._M_dataplus._M_p,
                              (local_248->Target->Name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\" is\nimplied to be ",0x13);
          if (pcVar10 == (char *)0x0) {
            std::ios::clear((int)poVar7 + (int)poVar7->_vptr_basic_ostream[-3]);
          }
          else {
            sVar8 = strlen(pcVar10);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar10,sVar8);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7,
                     " because it was used to determine the link libraries\nalready. The INTERFACE_"
                     ,0x4c);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,(p->_M_dataplus)._M_p,p->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7," property on\ndependency \"",0x19);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,(local_270->Target->Name)._M_dataplus._M_p,
                              (local_270->Target->Name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\" is in conflict.\n",0x12);
          std::__cxx11::stringbuf::str();
          cmSystemTools::Error((char *)local_268,(char *)0x0,(char *)0x0,(char *)0x0);
          if (local_268 != local_258) {
            operator_delete(local_268,local_258[0] + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e0);
          std::ios_base::~ios_base(local_170);
          bVar2 = true;
          local_2a0 = 0;
        }
        else {
          if (_Var3._M_current != pbVar1) {
            std::__cxx11::string::_M_append((char *)&local_240,(ulong)local_290._M_dataplus._M_p);
            compatibilityAgree_abi_cxx11_(local_1e0,t,false);
            std::__cxx11::string::_M_append((char *)&local_240,(ulong)local_1e0[0]._M_dataplus._M_p)
            ;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1e0[0]._M_dataplus._M_p != &local_1e0[0].field_2) {
              operator_delete(local_1e0[0]._M_dataplus._M_p,
                              local_1e0[0].field_2._M_allocated_capacity + 1);
            }
            if (bVar2 != local_2a0._0_1_) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e0);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e0,"Property ",9)
              ;
              poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_1e0,(p->_M_dataplus)._M_p,p->_M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7," on target \"",0xc);
              poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar7,(local_248->Target->Name)._M_dataplus._M_p,
                                  (local_248->Target->Name)._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar7,"\" does\nnot match the INTERFACE_",0x1f);
              poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar7,(p->_M_dataplus)._M_p,p->_M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar7," property requirement\nof dependency \"",0x25);
              poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar7,(local_270->Target->Name)._M_dataplus._M_p,
                                  (local_270->Target->Name)._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\".\n",3);
              std::__cxx11::stringbuf::str();
              cmSystemTools::Error((char *)local_268,(char *)0x0,(char *)0x0,(char *)0x0);
LAB_00390335:
              if (local_268 != local_258) {
                operator_delete(local_268,local_258[0] + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e0);
              std::ios_base::~ios_base(local_170);
              bVar2 = true;
              goto LAB_0039065b;
            }
          }
LAB_00390655:
          bVar2 = false;
        }
LAB_0039065b:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_290._M_dataplus._M_p != &local_290.field_2) {
          operator_delete(local_290._M_dataplus._M_p,
                          CONCAT71(local_290.field_2._M_allocated_capacity._1_7_,
                                   local_290.field_2._M_local_buf[0]) + 1);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_1f8);
      } while ((!bVar2) &&
              (ppcVar6 = local_200 + 1,
              ppcVar6 !=
              (pvVar5->
              super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
              )._M_impl.super__Vector_impl_data._M_finish));
    }
    iVar9 = 0x4c763a;
    if (local_2a0 != 0) {
      iVar9 = 0x4c6a75;
    }
    local_1e0[0]._M_dataplus._M_p = (pointer)&local_1e0[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1e0,iVar9,(local_2a0 ^ 5) + iVar9);
    this = local_248;
    compatibilityType_abi_cxx11_(&local_290,t);
    cmGeneratorTarget::ReportPropertyOrigin(this,p,local_1e0,&local_240,&local_290);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != &local_290.field_2) {
      operator_delete(local_290._M_dataplus._M_p,
                      CONCAT71(local_290.field_2._M_allocated_capacity._1_7_,
                               local_290.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0[0]._M_dataplus._M_p != &local_1e0[0].field_2) {
      operator_delete(local_1e0[0]._M_dataplus._M_p,local_1e0[0].field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    bVar2 = local_2a0._0_1_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != &local_240.field_2) {
      operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
    }
  }
  local_2a0._0_1_ = bVar2;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  return local_2a0._0_1_;
}

Assistant:

PropertyType checkInterfacePropertyCompatibility(cmGeneratorTarget const* tgt,
                                          const std::string &p,
                                          const std::string& config,
                                          const char *defaultValue,
                                          CompatibleType t,
                                          PropertyType *)
{
  PropertyType propContent = getTypedProperty<PropertyType>(tgt, p);
  std::vector<std::string> headPropKeys = tgt->GetPropertyKeys();
  const bool explicitlySet =
      std::find(headPropKeys.begin(), headPropKeys.end(),
                p) != headPropKeys.end();

  const bool impliedByUse =
          tgt->IsNullImpliedByLinkLibraries(p);
  assert((impliedByUse ^ explicitlySet)
      || (!impliedByUse && !explicitlySet));

  std::vector<cmGeneratorTarget const*> const& deps =
    tgt->GetLinkImplementationClosure(config);

  if(deps.empty())
    {
    return propContent;
    }
  bool propInitialized = explicitlySet;

  std::string report = " * Target \"";
  report += tgt->GetName();
  if (explicitlySet)
    {
    report += "\" has property content \"";
    report += valueAsString<PropertyType>(propContent);
    report += "\"\n";
    }
  else if (impliedByUse)
    {
    report += "\" property is implied by use.\n";
    }
  else
    {
    report += "\" property not set.\n";
    }

  std::string interfaceProperty = "INTERFACE_" + p;
  for(std::vector<cmGeneratorTarget const*>::const_iterator li =
      deps.begin();
      li != deps.end(); ++li)
    {
    // An error should be reported if one dependency
    // has INTERFACE_POSITION_INDEPENDENT_CODE ON and the other
    // has INTERFACE_POSITION_INDEPENDENT_CODE OFF, or if the
    // target itself has a POSITION_INDEPENDENT_CODE which disagrees
    // with a dependency.

    cmGeneratorTarget const* theTarget = *li;

    std::vector<std::string> propKeys = theTarget->GetPropertyKeys();

    const bool ifaceIsSet =
        std::find(propKeys.begin(), propKeys.end(),
                  interfaceProperty) != propKeys.end();
    PropertyType ifacePropContent =
                    getTypedProperty<PropertyType>(theTarget,
                              interfaceProperty);

    std::string reportEntry;
    if (ifaceIsSet)
      {
      reportEntry += " * Target \"";
      reportEntry += theTarget->GetName();
      reportEntry += "\" property value \"";
      reportEntry += valueAsString<PropertyType>(ifacePropContent);
      reportEntry += "\" ";
      }

    if (explicitlySet)
      {
      if (ifaceIsSet)
        {
        std::pair<bool, PropertyType> consistent =
                                  consistentProperty(propContent,
                                                     ifacePropContent, t);
        report += reportEntry;
        report += compatibilityAgree(t, propContent != consistent.second);
        if (!consistent.first)
          {
          std::ostringstream e;
          e << "Property " << p << " on target \""
            << tgt->GetName() << "\" does\nnot match the "
            "INTERFACE_" << p << " property requirement\nof "
            "dependency \"" << theTarget->GetName() << "\".\n";
          cmSystemTools::Error(e.str().c_str());
          break;
          }
        else
          {
          propContent = consistent.second;
          continue;
          }
        }
      else
        {
        // Explicitly set on target and not set in iface. Can't disagree.
        continue;
        }
      }
    else if (impliedByUse)
      {
      propContent = impliedValue<PropertyType>(propContent);

      if (ifaceIsSet)
        {
        std::pair<bool, PropertyType> consistent =
                                  consistentProperty(propContent,
                                                     ifacePropContent, t);
        report += reportEntry;
        report += compatibilityAgree(t, propContent != consistent.second);
        if (!consistent.first)
          {
          std::ostringstream e;
          e << "Property " << p << " on target \""
            << tgt->GetName() << "\" is\nimplied to be " << defaultValue
            << " because it was used to determine the link libraries\n"
               "already. The INTERFACE_" << p << " property on\ndependency \""
            << theTarget->GetName() << "\" is in conflict.\n";
          cmSystemTools::Error(e.str().c_str());
          break;
          }
        else
          {
          propContent = consistent.second;
          continue;
          }
        }
      else
        {
        // Implicitly set on target and not set in iface. Can't disagree.
        continue;
        }
      }
    else
      {
      if (ifaceIsSet)
        {
        if (propInitialized)
          {
          std::pair<bool, PropertyType> consistent =
                                    consistentProperty(propContent,
                                                       ifacePropContent, t);
          report += reportEntry;
          report += compatibilityAgree(t, propContent != consistent.second);
          if (!consistent.first)
            {
            std::ostringstream e;
            e << "The INTERFACE_" << p << " property of \""
              << theTarget->GetName() << "\" does\nnot agree with the value "
                "of " << p << " already determined\nfor \""
              << tgt->GetName() << "\".\n";
            cmSystemTools::Error(e.str().c_str());
            break;
            }
          else
            {
            propContent = consistent.second;
            continue;
            }
          }
        else
          {
          report += reportEntry + "(Interface set)\n";
          propContent = ifacePropContent;
          propInitialized = true;
          }
        }
      else
        {
        // Not set. Nothing to agree on.
        continue;
        }
      }
    }

  tgt->ReportPropertyOrigin(p, valueAsString<PropertyType>(propContent),
                            report, compatibilityType(t));
  return propContent;
}